

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

RPCHelpMan * createrawtransaction(void)

{
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  RPCExamples *in_stack_fffffffffffffbb8;
  RPCResult *pRVar2;
  anon_class_1_0_00000001 *in_stack_fffffffffffffbc0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffffbc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  string *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  string *psVar3;
  allocator<char> *in_stack_fffffffffffffbf8;
  allocator<char> *__a;
  char *in_stack_fffffffffffffc00;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *inner;
  RPCHelpMan *this_00;
  undefined1 local_390 [33];
  allocator<char> local_36f;
  undefined1 local_36e;
  undefined1 local_36d [2];
  allocator<char> local_36b;
  undefined1 local_36a [2];
  pointer local_368;
  pointer pRStack_360;
  undefined8 local_358;
  vector<RPCResult,_std::allocator<RPCResult>_> local_34a [2];
  allocator<char> local_312;
  allocator<char> local_311 [17];
  RPCExamples *in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd08;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd18;
  string *in_stack_fffffffffffffd20;
  RPCHelpMan *in_stack_fffffffffffffd28;
  RPCMethodImpl *in_stack_fffffffffffffe20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  pRVar2 = (RPCResult *)&local_312;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  CreateTxDoc();
  psVar3 = (string *)
           ((long)&local_34a[0].super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                   super__Vector_impl_data._M_start + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  inner = local_34a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  local_368 = (pointer)0x0;
  pRStack_360 = (pointer)0x0;
  local_358 = 0;
  skip_type_check = (undefined1)((ulong)&local_368 >> 0x38);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffbb8);
  RPCResult::RPCResult
            ((RPCResult *)this_00,(Type)((ulong)in_RDI >> 0x20),(string *)pRVar2,psVar3,inner,
             (bool)skip_type_check);
  RPCResults::RPCResults((RPCResults *)in_RDI,pRVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_36a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  HelpExampleCli(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  __s = &local_36b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,in_stack_fffffffffffffbf8);
  __a = (allocator<char> *)(local_36d + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  HelpExampleCli(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  std::operator+(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  psVar3 = (string *)local_36d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  args = (string *)&local_36e;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  HelpExampleRpc(psVar3,args);
  std::operator+(psVar3,args);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  HelpExampleRpc(psVar3,args);
  std::operator+(psVar3,args);
  RPCExamples::RPCExamples(in_stack_fffffffffffffbb8,(string *)0x69aaf2);
  pRVar2 = (RPCResult *)local_390;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<createrawtransaction()::__0,void>(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  RPCHelpMan::RPCHelpMan
            (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             in_stack_fffffffffffffd10,(RPCResults *)in_stack_fffffffffffffd08,
             in_stack_fffffffffffffd00,in_stack_fffffffffffffe20);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)pRVar2);
  RPCExamples::~RPCExamples((RPCExamples *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)(local_390 + 0x20));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_36f);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)&local_36e);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)local_36d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)(local_36d + 1));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_36b);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)local_36a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)(local_36a + 1));
  RPCResults::~RPCResults((RPCResults *)pRVar2);
  RPCResult::~RPCResult(pRVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator((allocator<char> *)local_34a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&local_34a[0].super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                     super__Vector_impl_data._M_start + 1));
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(&local_312);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pRVar2);
  std::allocator<char>::~allocator(local_311);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan createrawtransaction()
{
    return RPCHelpMan{"createrawtransaction",
                "\nCreate a transaction spending the given inputs and creating new outputs.\n"
                "Outputs can be addresses or data.\n"
                "Returns hex-encoded raw transaction.\n"
                "Note that the transaction's inputs are not signed, and\n"
                "it is not stored in the wallet or transmitted to the network.\n",
                CreateTxDoc(),
                RPCResult{
                    RPCResult::Type::STR_HEX, "transaction", "hex string of the transaction"
                },
                RPCExamples{
                    HelpExampleCli("createrawtransaction", "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\" \"[{\\\"address\\\":0.01}]\"")
            + HelpExampleCli("createrawtransaction", "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\" \"[{\\\"data\\\":\\\"00010203\\\"}]\"")
            + HelpExampleRpc("createrawtransaction", "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\", \"[{\\\"address\\\":0.01}]\"")
            + HelpExampleRpc("createrawtransaction", "\"[{\\\"txid\\\":\\\"myid\\\",\\\"vout\\\":0}]\", \"[{\\\"data\\\":\\\"00010203\\\"}]\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::optional<bool> rbf;
    if (!request.params[3].isNull()) {
        rbf = request.params[3].get_bool();
    }
    CMutableTransaction rawTx = ConstructTransaction(request.params[0], request.params[1], request.params[2], rbf);

    return EncodeHexTx(CTransaction(rawTx));
},
    };
}